

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack,qsizetype from,QByteArrayView needle)

{
  char *__s2;
  int iVar1;
  qsizetype qVar2;
  size_t __n;
  long lVar3;
  qsizetype qVar4;
  size_t sVar5;
  QtPrivate *this;
  long lVar6;
  byte *__s1;
  long lVar7;
  QByteArrayView haystack_00;
  
  __s1 = (byte *)needle.m_data;
  __n = needle.m_size;
  haystack_00.m_size = haystack.m_data;
  this = (QtPrivate *)haystack.m_size;
  if (this == (QtPrivate *)0x0) {
    qVar2 = -(ulong)(__n != 0 || from != 0);
  }
  else {
    if (__n == 1) {
      haystack_00.m_data = (storage_type *)from;
      qVar2 = lastIndexOf(this,haystack_00,(ulong)*__s1,(uchar)needle.m_data);
      return qVar2;
    }
    qVar2 = -1;
    if (from <= (long)this) {
      lVar6 = (long)this - __n;
      qVar4 = from;
      if (lVar6 < from) {
        qVar4 = lVar6;
      }
      if (from < 0) {
        qVar4 = lVar6;
      }
      if (-1 < qVar4) {
        lVar6 = 0;
        sVar5 = 0;
        if (0 < (long)__n) {
          sVar5 = __n;
        }
        lVar7 = 0;
        lVar3 = 0;
        for (; -lVar6 != sVar5; lVar6 = lVar6 + -1) {
          lVar7 = (long)(char)__s1[lVar6 + (__n - 1)] + lVar7 * 2;
          lVar3 = (long)(haystack_00.m_size + qVar4)[lVar6 + (__n - 1)] + lVar3 * 2;
        }
        lVar3 = lVar3 - haystack_00.m_size[qVar4];
        for (; __s2 = haystack_00.m_size + qVar4, haystack_00.m_size <= __s2; qVar4 = qVar4 + -1) {
          lVar3 = lVar3 + *__s2;
          if ((lVar3 == lVar7) && (iVar1 = bcmp(__s1,__s2,__n), iVar1 == 0)) {
            return qVar4;
          }
          if (__n - 1 < 0x40) {
            lVar3 = lVar3 - ((long)haystack_00.m_size[qVar4 + (__n - 1)] << ((byte)(__n - 1) & 0x3f)
                            );
          }
          lVar3 = lVar3 * 2;
        }
        qVar2 = -1;
      }
    }
  }
  return qVar2;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QByteArrayView haystack, qsizetype from, QByteArrayView needle) noexcept
{
    if (haystack.isEmpty()) {
        if (needle.isEmpty() && from == 0)
            return 0;
        return -1;
    }
    const auto ol = needle.size();
    if (ol == 1)
        return QtPrivate::lastIndexOf(haystack, from, needle.front());

    return lastIndexOfHelper(haystack.data(), haystack.size(), needle.data(), ol, from);
}